

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_xmlmodelserialiser.cpp
# Opt level: O0

void __thiscall tst_XmlModelSerialiser::validateXmlOutput_data(tst_XmlModelSerialiser *this)

{
  QTestData *pQVar1;
  QAbstractItemModel *local_38;
  QAbstractItemModel *local_30;
  QAbstractItemModel *local_28;
  QAbstractItemModel *local_20;
  QAbstractItemModel *local_18;
  tst_XmlModelSerialiser *local_10;
  tst_XmlModelSerialiser *this_local;
  
  local_10 = this;
  QTest::addColumn<QAbstractItemModel_const*>("sourceModel",(QAbstractItemModel **)0x0);
  pQVar1 = (QTestData *)QTest::newRow("List Single Role");
  local_18 = tst_SerialiserCommon::createStringModel
                       (&this->super_tst_SerialiserCommon,&this->super_QObject);
  operator<<(pQVar1,&local_18);
  pQVar1 = (QTestData *)QTest::newRow("Table Single Role");
  local_20 = tst_SerialiserCommon::createComplexModel
                       (&this->super_tst_SerialiserCommon,false,false,&this->super_QObject);
  operator<<(pQVar1,&local_20);
  pQVar1 = (QTestData *)QTest::newRow("Table Multi Roles");
  local_28 = tst_SerialiserCommon::createComplexModel
                       (&this->super_tst_SerialiserCommon,false,true,&this->super_QObject);
  operator<<(pQVar1,&local_28);
  pQVar1 = (QTestData *)QTest::newRow("Tree Single Role");
  local_30 = tst_SerialiserCommon::createComplexModel
                       (&this->super_tst_SerialiserCommon,true,false,&this->super_QObject);
  operator<<(pQVar1,&local_30);
  pQVar1 = (QTestData *)QTest::newRow("Tree Multi Roles");
  local_38 = tst_SerialiserCommon::createComplexModel
                       (&this->super_tst_SerialiserCommon,true,true,&this->super_QObject);
  operator<<(pQVar1,&local_38);
  return;
}

Assistant:

void tst_XmlModelSerialiser::validateXmlOutput_data()
{
    QTest::addColumn<const QAbstractItemModel *>("sourceModel");
    QTest::newRow("List Single Role") << static_cast<const QAbstractItemModel *>(createStringModel(this));
#ifdef COMPLEX_MODEL_SUPPORT
    QTest::newRow("Table Single Role") << static_cast<const QAbstractItemModel *>(createComplexModel(false, false, this));
    QTest::newRow("Table Multi Roles") << static_cast<const QAbstractItemModel *>(createComplexModel(false, true, this));
    QTest::newRow("Tree Single Role") << static_cast<const QAbstractItemModel *>(createComplexModel(true, false, this));
    QTest::newRow("Tree Multi Roles") << static_cast<const QAbstractItemModel *>(createComplexModel(true, true, this));
#endif
}